

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O0

double xc_bessel_I1_scaled(double x)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double r;
  double y;
  double x_small;
  double xmin;
  double local_28;
  
  dVar1 = sqrt(2.220446049250313e-16);
  dVar2 = ABS(in_XMM0_Qa);
  local_28 = 0.0;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    if (4.450147717014403e-308 <= dVar2) {
      if (dVar1 * 2.8284271247461903 <= dVar2) {
        if (3.0 < dVar2) {
          if (8.0 < dVar2) {
            dVar1 = xc_cheb_eval(16.0 / dVar2 - 1.0,ai12_data,0x16);
            local_28 = sqrt(dVar2);
            local_28 = (dVar1 + 0.375) / local_28;
          }
          else {
            dVar1 = xc_cheb_eval((48.0 / dVar2 - 11.0) / 5.0,ai1_data,0x15);
            local_28 = sqrt(dVar2);
            local_28 = (dVar1 + 0.375) / local_28;
          }
          local_28 = (double)(~-(ulong)(0.0 < in_XMM0_Qa) & 0xbff0000000000000 |
                             (ulong)((uint)(-(ulong)(0.0 < in_XMM0_Qa) >> 0x20) & 0x3ff00000) <<
                             0x20) * local_28;
        }
        else {
          dVar1 = exp(-dVar2);
          dVar2 = xc_cheb_eval((dVar2 * dVar2) / 4.5 - 1.0,bi1_data,0xb);
          local_28 = in_XMM0_Qa * dVar1 * (dVar2 + 0.875);
        }
      }
      else {
        local_28 = exp(-dVar2);
        local_28 = in_XMM0_Qa * 0.5 * local_28;
      }
    }
    else {
      fprintf(_stderr,"Underflow error in bessel_I1_scaled\n");
    }
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

GPU_FUNCTION
double xc_bessel_I1_scaled(const double x)
{
  const double xmin    = 2.0 * DBL_MIN;
  const double x_small = 2.0 * M_SQRT2 * SQRT_DBL_EPSILON;
  const double y = fabs(x);
  double r = 0.0;

  if(y == 0.0)
    r = 0.0;
  else if(y < xmin) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Underflow error in bessel_I1_scaled\n");
#endif
  } else if(y < x_small)
    r = 0.5*x*exp(-y);
  else if(y <= 3.0)
    r = x*exp(-y)*(0.875 + xc_cheb_eval(y*y/4.5 - 1.0, bi1_data, 11));
  else{
    if(y <= 8.0)
      r = (0.375 + xc_cheb_eval((48.0/y - 11.0)/5.0, ai1_data, 21))/sqrt(y);
    else
      r = (0.375 + xc_cheb_eval(16.0/y - 1.0, ai12_data, 22))/sqrt(y);

    r *= (x > 0.0 ? 1.0 : -1.0);
  }

  return r;
}